

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_app.h
# Opt level: O2

void sapp_set_icon(sapp_icon_desc *desc)

{
  uint32_t *puVar1;
  size_t sVar2;
  void *pvVar3;
  sapp_icon_desc *psVar4;
  sapp_image_desc *psVar5;
  wchar_t i;
  ulong *ptr;
  uint32_t *puVar6;
  wchar_t img_index;
  uint32_t uVar7;
  long lVar8;
  ulong uVar9;
  ulong *puVar10;
  long lVar11;
  wchar_t x;
  int iVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  size_t *psVar16;
  uint32_t *puVar17;
  char cVar18;
  ulong uVar19;
  int iVar20;
  uint32_t *puVar21;
  uint32_t uVar22;
  uint32_t *puVar23;
  bool bVar24;
  
  if (desc == (sapp_icon_desc *)0x0) {
    __assert_fail("desc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_app.h"
                  ,0x2f4b,"void sapp_set_icon(const sapp_icon_desc *)");
  }
  if ((desc->sokol_default == true) &&
     (desc = &_sapp.default_icon_desc, _sapp.default_icon_pixels == (uint32_t *)0x0)) {
    puVar6 = (uint32_t *)_sapp_malloc_clear(0x5400);
    psVar16 = &_sapp.default_icon_desc.images[0].pixels.size;
    lVar8 = 0;
    _sapp.default_icon_pixels = puVar6;
    for (lVar11 = 0; puVar1 = (uint32_t *)((long)puVar6 + lVar8), lVar11 != 0xc; lVar11 = lVar11 + 4
        ) {
      iVar20 = *(int *)((long)&DAT_0018d690 + lVar11);
      *(int *)(psVar16 + -2) = iVar20;
      *(int *)((long)psVar16 + -0xc) = iVar20;
      ((sapp_range *)(psVar16 + -1))->ptr = puVar1;
      *psVar16 = (ulong)(uint)(iVar20 * iVar20) * 4;
      lVar8 = lVar8 + (ulong)(uint)(iVar20 * iVar20) * 4;
      psVar16 = psVar16 + 3;
    }
    puVar17 = puVar6;
    for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
      iVar20 = (int)((long)(int)(&DAT_0018d690)[lVar8] / 8);
      uVar19 = (long)(int)(&DAT_0018d690)[lVar8] / 8 & 0xffffffff;
      if (iVar20 < 1) {
        iVar20 = 0;
      }
      for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 1) {
        uVar7 = (&DAT_00194920)[lVar11];
        for (iVar14 = 0; iVar14 != iVar20; iVar14 = iVar14 + 1) {
          cVar18 = (&DAT_00190544)[lVar11];
          for (iVar12 = 0; iVar12 != 8; iVar12 = iVar12 + 1) {
            uVar9 = uVar19;
            uVar22 = uVar7;
            if (-1 < cVar18) {
              uVar22 = 0xffffff;
            }
            while ((int)uVar9 != 0) {
              if (puVar1 <= puVar17) {
                __assert_fail("dst < dst_end",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_app.h"
                              ,0xc3a,"void _sapp_setup_default_icon(void)");
              }
              *puVar17 = uVar22;
              puVar17 = puVar17 + 1;
              uVar9 = (ulong)((int)uVar9 - 1);
            }
            cVar18 = cVar18 * '\x02';
          }
        }
      }
    }
    if (puVar17 != puVar1) {
      __assert_fail("dst == dst_end",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_app.h"
                    ,0xc41,"void _sapp_setup_default_icon(void)");
    }
    puVar17 = puVar6;
    for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
      uVar13 = (&DAT_0018d690)[lVar8];
      uVar19 = 0;
      if (0 < (int)uVar13) {
        uVar19 = (ulong)uVar13;
      }
      puVar23 = puVar17;
      for (uVar9 = 0; uVar9 != uVar19; uVar9 = uVar9 + 1) {
        uVar7 = 0xffffff;
        for (uVar15 = 0; uVar13 != uVar15; uVar15 = uVar15 + 1) {
          uVar22 = puVar23[uVar15];
          if (uVar7 != 0xffffff && uVar22 == 0xffffff) {
            puVar23[uVar15] = 0xff000000;
          }
          uVar7 = uVar22;
        }
        puVar23 = puVar23 + (int)uVar13;
      }
      puVar17 = puVar17 + uVar13 * uVar13;
    }
    if (puVar17 != puVar1) {
      __assert_fail("dst == dst_end",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_app.h"
                    ,0xc54,"void _sapp_setup_default_icon(void)");
    }
    puVar17 = puVar6;
    for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
      uVar13 = (&DAT_0018d690)[lVar8];
      uVar19 = 0;
      if (0 < (int)uVar13) {
        uVar19 = (ulong)uVar13;
      }
      puVar23 = puVar17;
      for (uVar9 = 0; uVar9 != uVar19; uVar9 = uVar9 + 1) {
        uVar15 = (ulong)uVar13;
        puVar21 = puVar23;
        uVar7 = 0xffffff;
        while (bVar24 = uVar15 != 0, uVar15 = uVar15 - 1, bVar24) {
          uVar22 = *puVar21;
          if (uVar7 != 0xffffff && uVar22 == 0xffffff) {
            *puVar21 = 0xff000000;
          }
          puVar21 = puVar21 + (int)uVar13;
          uVar7 = uVar22;
        }
        puVar23 = puVar23 + 1;
      }
      puVar17 = puVar17 + uVar13 * uVar13;
    }
    if (puVar17 != puVar1) {
      __assert_fail("dst == dst_end",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_app.h"
                    ,0xc67,"void _sapp_setup_default_icon(void)");
    }
    if (puVar6 == (uint32_t *)0x0) {
      __assert_fail("0 != _sapp.default_icon_pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_app.h"
                    ,0x2f50,"void sapp_set_icon(const sapp_icon_desc *)");
    }
  }
  uVar13 = 8;
  psVar5 = desc->images;
  for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
    if ((psVar5->pixels).ptr == (void *)0x0) {
      if (lVar8 == 0) {
        return;
      }
      uVar13 = (uint)lVar8;
      break;
    }
    psVar5 = (sapp_image_desc *)(&psVar5->pixels + 1);
  }
  uVar19 = (ulong)uVar13;
  lVar8 = 1;
  psVar4 = desc;
  do {
    psVar16 = &psVar4->images[0].pixels.size;
    if (uVar19 + lVar8 == 1) goto LAB_0010b6f2;
    iVar20 = psVar4->images[0].width;
    if (iVar20 < 1) {
      __assert_fail("desc->width > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_app.h"
                    ,0xbc8,"_Bool _sapp_image_validate(const sapp_image_desc *)");
    }
    iVar14 = psVar4->images[0].height;
    if (iVar14 < 1) {
      __assert_fail("desc->height > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_app.h"
                    ,0xbc9,"_Bool _sapp_image_validate(const sapp_image_desc *)");
    }
    if (psVar4->images[0].pixels.ptr == (void *)0x0) {
      __assert_fail("desc->pixels.ptr != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_app.h"
                    ,0xbca,"_Bool _sapp_image_validate(const sapp_image_desc *)");
    }
    sVar2 = *psVar16;
    if (sVar2 == 0) {
      __assert_fail("desc->pixels.size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_app.h"
                    ,0xbcb,"_Bool _sapp_image_validate(const sapp_image_desc *)");
    }
    lVar8 = lVar8 + -1;
    psVar4 = (sapp_icon_desc *)psVar16;
  } while ((ulong)(uint)(iVar14 * iVar20) << 2 == sVar2);
  _sapp_log("Image data size mismatch (must be width*height*4 bytes)\n");
  if (-lVar8 < (long)(int)uVar13) {
    return;
  }
LAB_0010b6f2:
  iVar20 = 0;
  for (lVar8 = 0; uVar19 * 0x18 - lVar8 != 0; lVar8 = lVar8 + 0x18) {
    iVar20 = iVar20 + *(int *)((long)&desc->images[0].height + lVar8) *
                      *(int *)((long)&desc->images[0].width + lVar8) + 2;
  }
  ptr = (ulong *)_sapp_malloc_clear((long)iVar20 << 3);
  puVar10 = ptr;
  for (uVar9 = 0; uVar9 != uVar19; uVar9 = uVar9 + 1) {
    pvVar3 = desc->images[uVar9].pixels.ptr;
    iVar14 = desc->images[uVar9].width;
    *puVar10 = (long)iVar14;
    iVar12 = desc->images[uVar9].height;
    puVar10[1] = (long)iVar12;
    puVar10 = puVar10 + 2;
    uVar13 = iVar12 * iVar14;
    if ((int)uVar13 < 1) {
      uVar13 = 0;
    }
    for (uVar15 = 0; uVar13 != uVar15; uVar15 = uVar15 + 1) {
      *puVar10 = (ulong)*(byte *)((long)pvVar3 + uVar15 * 4 + 3) << 0x18 |
                 (ulong)*(byte *)((long)pvVar3 + uVar15 * 4 + 2) |
                 (ulong)((uint)*(byte *)((long)pvVar3 + uVar15 * 4 + 1) << 8 |
                        (uint)*(byte *)((long)pvVar3 + uVar15 * 4) << 0x10);
      puVar10 = puVar10 + 1;
    }
  }
  XChangeProperty(_sapp.x11.display,_sapp.x11.window,_sapp.x11.NET_WM_ICON,6,0x20,0,ptr,iVar20);
  _sapp_free(ptr);
  XFlush(_sapp.x11.display);
  return;
}

Assistant:

SOKOL_API_IMPL void sapp_set_icon(const sapp_icon_desc* desc) {
    SOKOL_ASSERT(desc);
    if (desc->sokol_default) {
        if (0 == _sapp.default_icon_pixels) {
            _sapp_setup_default_icon();
        }
        SOKOL_ASSERT(0 != _sapp.default_icon_pixels);
        desc = &_sapp.default_icon_desc;
    }
    const int num_images = _sapp_icon_num_images(desc);
    if (num_images == 0) {
        return;
    }
    SOKOL_ASSERT((num_images > 0) && (num_images <= SAPP_MAX_ICONIMAGES));
    if (!_sapp_validate_icon_desc(desc, num_images)) {
        return;
    }
    #if defined(_SAPP_MACOS)
        _sapp_macos_set_icon(desc, num_images);
    #elif defined(_SAPP_WIN32)
        _sapp_win32_set_icon(desc, num_images);
    #elif defined(_SAPP_LINUX)
        _sapp_x11_set_icon(desc, num_images);
    #elif defined(_SAPP_EMSCRIPTEN)
        _sapp_emsc_set_icon(desc, num_images);
    #endif
}